

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

string * __thiscall ncnn::ParamDict::get(ParamDict *this,int id,string *def)

{
  string *in_RCX;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  string *local_40;
  
  local_40 = in_RCX;
  if (*(int *)(*(long *)(in_RSI + 8) + (long)in_EDX * 0x70) != 0) {
    local_40 = (string *)(*(long *)(in_RSI + 8) + (long)in_EDX * 0x70 + 0x50);
  }
  std::__cxx11::string::string((string *)in_RDI,local_40);
  return in_RDI;
}

Assistant:

std::string ParamDict::get(int id, const std::string& def) const
{
    return d->params[id].type ? d->params[id].s : def;
}